

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_constraint_handler_s.c
# Opt level: O0

constraint_handler_t set_constraint_handler_s(constraint_handler_t handler)

{
  constraint_handler_t p_Var1;
  constraint_handler_t previous;
  constraint_handler_t handler_local;
  
  p_Var1 = _PDCLIB_constraint_handler;
  _PDCLIB_constraint_handler = handler;
  if (handler == (constraint_handler_t)0x0) {
    _PDCLIB_constraint_handler = abort_handler_s;
  }
  return p_Var1;
}

Assistant:

constraint_handler_t set_constraint_handler_s( constraint_handler_t handler )
{
    constraint_handler_t previous = _PDCLIB_constraint_handler;

    if ( handler == NULL )
    {
        _PDCLIB_constraint_handler = abort_handler_s;
    }
    else
    {
        _PDCLIB_constraint_handler = handler;
    }

    return previous;
}